

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psftp.c
# Opt level: O0

int sftp_cmd_mv(sftp_command *cmd)

{
  _Bool _Var1;
  uint local_30;
  int local_2c;
  int ret;
  int i;
  sftp_context_mv ctx [1];
  sftp_command *cmd_local;
  
  ctx[0]._8_8_ = cmd;
  if (backend == (Backend *)0x0) {
    not_connected();
    cmd_local._4_4_ = 0;
  }
  else if (cmd->nwords < 3) {
    printf("mv: expects two filenames\n");
    cmd_local._4_4_ = 0;
  }
  else {
    _ret = canonify(cmd->words[cmd->nwords - 1]);
    ctx[0].dstfname._0_1_ = check_is_dir(_ret);
    if (((*(ulong *)(ctx[0]._8_8_ + 8) < 4) &&
        (_Var1 = is_wildcard(*(char **)(*(long *)ctx[0]._8_8_ + 8)), !_Var1)) ||
       (((byte)ctx[0].dstfname & 1) != 0)) {
      local_30 = 1;
      for (local_2c = 1; (ulong)(long)local_2c < *(long *)(ctx[0]._8_8_ + 8) - 1U;
          local_2c = local_2c + 1) {
        _Var1 = wildcard_iterate(*(char **)(*(long *)ctx[0]._8_8_ + (long)local_2c * 8),
                                 sftp_action_mv,&ret);
        local_30 = _Var1 & local_30;
      }
      safefree(_ret);
      cmd_local._4_4_ = local_30;
    }
    else {
      printf("mv: multiple or wildcard arguments require the destination to be a directory\n");
      safefree(_ret);
      cmd_local._4_4_ = 0;
    }
  }
  return cmd_local._4_4_;
}

Assistant:

int sftp_cmd_mv(struct sftp_command *cmd)
{
    struct sftp_context_mv ctx[1];
    int i, ret;

    if (!backend) {
        not_connected();
        return 0;
    }

    if (cmd->nwords < 3) {
        printf("mv: expects two filenames\n");
        return 0;
    }

    ctx->dstfname = canonify(cmd->words[cmd->nwords-1]);

    /*
     * If there's more than one source argument, or one source
     * argument which is a wildcard, we _require_ that the
     * destination is a directory.
     */
    ctx->dest_is_dir = check_is_dir(ctx->dstfname);
    if ((cmd->nwords > 3 || is_wildcard(cmd->words[1])) && !ctx->dest_is_dir) {
        printf("mv: multiple or wildcard arguments require the destination"
               " to be a directory\n");
        sfree(ctx->dstfname);
        return 0;
    }

    /*
     * Now iterate over the source arguments.
     */
    ret = 1;
    for (i = 1; i < cmd->nwords-1; i++)
        ret &= wildcard_iterate(cmd->words[i], sftp_action_mv, ctx);

    sfree(ctx->dstfname);
    return ret;
}